

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pardiso_interface.c
# Opt level: O2

c_int solve_linsys_pardiso(pardiso_solver *s,c_float *b)

{
  long lVar1;
  c_int cVar2;
  long lVar3;
  long lVar4;
  
  s->phase = 0x21;
  pardiso(s->pt,&s->maxfct,&s->mnum,&s->mtype,&s->phase,&s->nKKT,s->KKT->x,s->KKT_p,s->KKT_i,
          &s->idum,&s->nrhs,s->iparm,&s->msglvl,b,s->sol,&s->error);
  if (s->error == 0) {
    if (s->polish == 0) {
      lVar1 = s->n;
      lVar3 = 0;
      lVar4 = 0;
      if (0 < lVar1) {
        lVar4 = lVar1;
      }
      for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
        b[lVar3] = s->sol[lVar3];
      }
      cVar2 = 0;
      lVar4 = s->m;
      if (s->m < 1) {
        lVar4 = cVar2;
      }
      for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
        b[lVar1 + lVar3] = s->rho_inv_vec[lVar3] * s->sol[lVar1 + lVar3] + b[lVar1 + lVar3];
      }
    }
    else {
      cVar2 = 0;
    }
  }
  else {
    printf("ERROR in %s: ","solve_linsys_pardiso");
    printf("Error during linear system solution: %d",(ulong)(uint)s->error);
    putchar(10);
    cVar2 = 1;
  }
  return cVar2;
}

Assistant:

c_int solve_linsys_pardiso(pardiso_solver * s, c_float * b) {
    c_int j;

    // Back substitution and iterative refinement
    s->phase = PARDISO_SOLVE;
    pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
             &(s->nKKT), s->KKT->x, s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
             s->iparm, &(s->msglvl), b, s->sol, &(s->error));
    if ( s->error != 0 ){
#ifdef PRINTING
        c_eprint("Error during linear system solution: %d", (int)s->error);
#endif
        return 1;
    }

    if (!(s->polish)) {
        /* copy x_tilde from s->sol */
        for (j = 0 ; j < s->n ; j++) {
            b[j] = s->sol[j];
        }

        /* compute z_tilde from b and s->sol */
        for (j = 0 ; j < s->m ; j++) {
            b[j + s->n] += s->rho_inv_vec[j] * s->sol[j + s->n];
        }
    }

    return 0;
}